

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_error(torrent *this,error_code *ec,file_index_t error_file)

{
  undefined3 uVar1;
  bool bVar2;
  alert_manager *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string local_4a8;
  string local_488;
  char local_468 [8];
  char buf [1024];
  string local_50;
  undefined1 local_30 [24];
  error_code *ec_local;
  torrent *this_local;
  file_index_t error_file_local;
  
  bVar2 = ec->failed_;
  uVar1 = *(undefined3 *)&ec->field_0x5;
  (this->m_error).val_ = ec->val_;
  (this->m_error).failed_ = bVar2;
  *(undefined3 *)&(this->m_error).field_0x5 = uVar1;
  (this->m_error).cat_ = ec->cat_;
  (this->m_error_file).m_val = error_file.m_val;
  local_30._16_8_ = ec;
  ec_local = (error_code *)this;
  this_local._4_4_ = error_file.m_val;
  update_gauge(this);
  paVar3 = alerts(this);
  bVar2 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
  if (bVar2) {
    paVar3 = alerts(this);
    get_handle((torrent *)local_30);
    uVar4 = local_30._16_8_;
    resolve_filename_abi_cxx11_(&local_50,this,this_local._4_4_);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string>
              (paVar3,(torrent_handle *)local_30,(error_code *)uVar4,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    torrent_handle::~torrent_handle((torrent_handle *)local_30);
  }
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_30._16_8_);
  if (bVar2) {
    boost::system::error_code::message_abi_cxx11_(&local_488,(error_code *)local_30._16_8_);
    uVar4 = ::std::__cxx11::string::c_str();
    resolve_filename_abi_cxx11_(&local_4a8,this,this_local._4_4_);
    uVar5 = ::std::__cxx11::string::c_str();
    snprintf(local_468,0x400,"error %s: %s",uVar4,uVar5);
    ::std::__cxx11::string::~string((string *)&local_4a8);
    ::std::__cxx11::string::~string((string *)&local_488);
    log_to_all_peers(this,local_468);
  }
  state_updated(this);
  update_state_list(this);
  return;
}

Assistant:

void torrent::set_error(error_code const& ec, file_index_t const error_file)
	{
		TORRENT_ASSERT(is_single_thread());
		m_error = ec;
		m_error_file = error_file;

		update_gauge();

		if (alerts().should_post<torrent_error_alert>())
			alerts().emplace_alert<torrent_error_alert>(get_handle(), ec
				, resolve_filename(error_file));

#ifndef TORRENT_DISABLE_LOGGING
		if (ec)
		{
			char buf[1024];
			std::snprintf(buf, sizeof(buf), "error %s: %s", ec.message().c_str()
				, resolve_filename(error_file).c_str());
			log_to_all_peers(buf);
		}
#endif

		state_updated();
		update_state_list();
	}